

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O3

bool __thiscall
ON_Plane::GetDistanceToBoundingBox(ON_Plane *this,ON_BoundingBox *Box,double *min,double *max)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ON_3dVector UnitNormal;
  ON_3dPoint P;
  double local_a0;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  local_78.z = (this->zaxis).z;
  local_78.x = (this->zaxis).x;
  local_78.y = (this->zaxis).y;
  bVar9 = ON_3dVector::Unitize(&local_78);
  if (bVar9) {
    ON_BoundingBox::Min(Box);
    ON_3dPoint::operator-(&local_48,&local_60,&this->origin);
    dVar11 = ON_3dVector::operator*(&local_48,&local_78);
    bVar6 = false;
    local_a0 = dVar11;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      bVar3 = false;
      bVar2 = true;
      do {
        bVar5 = bVar2;
        bVar2 = false;
        dVar12 = dVar11;
        bVar8 = true;
        do {
          bVar4 = bVar8;
          dVar11 = dVar12;
          dVar1 = local_a0;
          if (bVar2 || (bVar3 || bVar6)) {
            if (bVar7) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar10 = ON_3dPoint::operator[](&local_60,0);
            dVar1 = *pdVar10;
            pdVar10 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,0);
            *pdVar10 = dVar1;
            if (bVar5) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar10 = ON_3dPoint::operator[](&local_60,1);
            dVar1 = *pdVar10;
            pdVar10 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,1);
            *pdVar10 = dVar1;
            if (bVar4) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar10 = ON_3dPoint::operator[](&local_60,2);
            dVar1 = *pdVar10;
            pdVar10 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,2);
            *pdVar10 = dVar1;
            ON_3dPoint::operator-((ON_3dVector *)&local_60,(ON_3dPoint *)&local_48,&this->origin);
            dVar13 = ON_3dVector::operator*((ON_3dVector *)&local_60,&local_78);
            dVar1 = dVar13;
            if ((local_a0 <= dVar13) && (dVar11 = dVar13, dVar1 = local_a0, dVar13 <= dVar12)) {
              dVar11 = dVar12;
            }
          }
          local_a0 = dVar1;
          bVar2 = true;
          dVar12 = dVar11;
          bVar8 = false;
        } while (bVar4);
        bVar3 = true;
        bVar2 = false;
      } while (bVar5);
      bVar6 = true;
      bVar3 = false;
    } while (bVar7);
    *min = local_a0;
    *max = dVar11;
  }
  return bVar9;
}

Assistant:

bool ON_Plane::GetDistanceToBoundingBox(const ON_BoundingBox& Box,
				                                double* min, double* max) const
{
  //min and max signed distance.  Returns false if plane normal has zero length.

  ON_3dVector UnitNormal = Normal();
  if (!UnitNormal.Unitize()) 
    return false;

  double mind, maxd;
  mind = maxd = (Box.Min() - Origin())*UnitNormal;
  int i0, i1, i2;
  for (i0=0;i0<2;i0++)
  {
    for(i1=0;i1<2;i1++) 
    {
      for (i2=0;i2<2;i2++) 
      {
        if (i0||i1||i2) 
        {
          ON_3dPoint P;
          P[0]=(i0)?Box.Max()[0]:Box.Min()[0];
          P[1]=(i1)?Box.Max()[1]:Box.Min()[1];
          P[2]=(i2)?Box.Max()[2]:Box.Min()[2];
          double d = (P - Origin())*UnitNormal;
          //double dd = P.DistanceTo(ClosestPointTo(P));
          if (d < mind) 
            mind=d;
          else if (d > maxd) 
            maxd=d;
        }
      }
    }
  }
  *min = mind;
  *max = maxd;
  return true;
}